

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_File_write_ordered
              (MPIABI_File fh,void *buf,int count,MPIABI_Datatype datatype,MPIABI_Status *status)

{
  int iVar1;
  WPI_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar1 = MPI_File_write_ordered();
  WPI_StatusPtr::~WPI_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_File_write_ordered(
  MPIABI_File fh,
  const void * buf,
  int count,
  MPIABI_Datatype datatype,
  MPIABI_Status * status
) {
  return MPI_File_write_ordered(
    (MPI_File)(WPI_File)fh,
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}